

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O2

errr finish_parse_ui_entry_renderer(parser *p)

{
  char *name;
  wchar_t wVar1;
  int iVar2;
  size_t sVar3;
  void *__dest;
  long lVar4;
  long lVar5;
  long lVar6;
  renderer_info *prVar7;
  wchar_t local_138 [66];
  
  lVar5 = 0;
  lVar6 = 0;
  do {
    prVar7 = renderers;
    if (renderer_count <= lVar6) {
      parser_destroy(p);
      return 0;
    }
    name = *(char **)((long)&renderers->comb_rend_nm + lVar5);
    if (name != (char *)0x0) {
      wVar1 = ui_entry_renderer_lookup(name);
      *(wchar_t *)((long)&prVar7->combined_renderer_index + lVar5) = wVar1;
      string_free(name);
      prVar7 = renderers;
      *(undefined8 *)((long)&renderers->comb_rend_nm + lVar5) = 0;
    }
    lVar4 = *(long *)((long)&prVar7->backend + lVar5);
    if (lVar4 != 0) {
      if (*(int *)((long)&prVar7->combiner_index + lVar5) == 0) {
        iVar2 = ui_entry_combiner_lookup(*(char **)(lVar4 + 0x10));
        prVar7 = renderers;
        *(int *)((long)&renderers->combiner_index + lVar5) = iVar2;
        if (iVar2 == 0) {
          __assert_fail("renderers[i].combiner_index != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-renderers.c"
                        ,0x754,"errr finish_parse_ui_entry_renderer(struct parser *)");
        }
        lVar4 = *(long *)((long)&prVar7->backend + lVar5);
      }
      augment_colors(*(char **)(lVar4 + 0x18),(int **)((long)&prVar7->colors + lVar5),
                     (int *)((long)&prVar7->ncolors + lVar5));
      augment_colors(*(char **)(*(long *)((long)&renderers->backend + lVar5) + 0x20),
                     (int **)((long)&renderers->label_colors + lVar5),
                     (int *)((long)&renderers->nlabcolors + lVar5));
      prVar7 = renderers;
      sVar3 = text_mbstowcs(local_138,
                            *(char **)(*(long *)((long)&renderers->backend + lVar5) + 0x28),L'@');
      if (sVar3 == 0xffffffffffffffff) {
        quit("Invalid encoding for default symbols");
      }
      iVar2 = (int)sVar3;
      if (*(int *)((long)&prVar7->nsym + lVar5) < iVar2) {
        __dest = mem_alloc(sVar3 * 4 + 4);
        lVar4 = (long)*(int *)((long)&prVar7->nsym + lVar5);
        if (0 < lVar4) {
          memcpy(__dest,*(void **)((long)&prVar7->symbols + lVar5),lVar4 << 2);
        }
        mem_free(*(void **)((long)&prVar7->symbols + lVar5));
        lVar4 = (long)*(int *)((long)&prVar7->nsym + lVar5);
        memcpy((void *)((long)__dest + lVar4 * 4),local_138 + lVar4,(iVar2 - lVar4) * 4);
        sVar3 = text_mbstowcs((wchar_t *)((long)__dest + sVar3 * 4),"",L'\x01');
        if (sVar3 == 0xffffffffffffffff) {
          quit("Couldn\'t terminate null character string");
        }
        *(int *)((long)&prVar7->nsym + lVar5) = iVar2;
        *(void **)((long)&prVar7->symbols + lVar5) = __dest;
      }
    }
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x58;
  } while( true );
}

Assistant:

static errr finish_parse_ui_entry_renderer(struct parser *p)
{
	int i;

	for (i = 0; i < renderer_count; ++i) {
		/* Get the combined value renderer. */
		if (renderers[i].comb_rend_nm) {
			renderers[i].combined_renderer_index =
				ui_entry_renderer_lookup(renderers[i].comb_rend_nm);
			string_free(renderers[i].comb_rend_nm);
			renderers[i].comb_rend_nm = NULL;
		}

		if (!renderers[i].backend) {
			continue;
		}

		/* Use the default combiner if nothing was set. */
		if (!renderers[i].combiner_index) {
			renderers[i].combiner_index = ui_entry_combiner_lookup(
				renderers[i].backend->default_combiner_name);
			assert(renderers[i].combiner_index != 0);
		}

		/*
		 * If have fewer colors or symbols than the defaults for the
		 * backend, augment what was set with the default values.
		 */
		augment_colors(renderers[i].backend->default_colors,
			&renderers[i].colors, &renderers[i].ncolors);
		augment_colors(renderers[i].backend->default_labelcolors,
			&renderers[i].label_colors, &renderers[i].nlabcolors);
		augment_symbols(renderers[i].backend->default_symbols,
			&renderers[i].symbols, &renderers[i].nsym);

		if (renderers[i].ndigit == INT_MIN) {
			renderers[i].ndigit =
				renderers[i].backend->default_ndigit;
		}
		if (renderers[i].sign == UI_ENTRY_SIGN_DEFAULT) {
			renderers[i].sign =
				renderers[i].backend->default_sign;
		}
	}
	parser_destroy(p);
	return 0;
}